

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O2

C_Node * init_desg_expr(C_Parser *parser,InitDesg *desg,C_Token *tok)

{
  C_Member *pCVar1;
  C_Node *pCVar2;
  C_Node *pCVar3;
  
  if (desg->var != (C_Obj *)0x0) {
    pCVar2 = new_var_node(parser,desg->var,tok);
    return pCVar2;
  }
  pCVar1 = desg->member;
  pCVar2 = init_desg_expr(parser,desg->next,tok);
  if (pCVar1 == (C_Member *)0x0) {
    pCVar3 = new_num(parser,(long)desg->idx,tok);
    pCVar2 = new_add(parser,pCVar2,pCVar3,tok);
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_DEREF;
    pCVar3->tok = tok;
    pCVar3->lhs = pCVar2;
  }
  else {
    pCVar3 = (C_Node *)(*parser->memory_allocator->calloc)(parser->memory_allocator->arena,1,0x120);
    pCVar3->kind = ND_MEMBER;
    pCVar3->tok = tok;
    pCVar3->lhs = pCVar2;
    pCVar3->member = desg->member;
  }
  return pCVar3;
}

Assistant:

static C_Node *init_desg_expr(C_Parser *parser, InitDesg *desg, C_Token *tok) {
  if (desg->var)
    return new_var_node(parser, desg->var, tok);

  if (desg->member) {
    C_Node *node = new_unary(parser, ND_MEMBER, init_desg_expr(parser, desg->next, tok), tok);
    node->member = desg->member;
    return node;
  }

  C_Node *lhs = init_desg_expr(parser, desg->next, tok);
  C_Node *rhs = new_num(parser, desg->idx, tok);
  return new_unary(parser, ND_DEREF, new_add(parser, lhs, rhs, tok), tok);
}